

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

int __thiscall cilk_fiber::remove_reference(cilk_fiber *this,cilk_fiber_pool *pool)

{
  int iVar1;
  long lVar2;
  cilk_fiber *in_RSI;
  cilk_fiber *in_RDI;
  int ref_count;
  uint in_stack_ffffffffffffffe8;
  
  lVar2 = dec_ref_count(in_RDI);
  iVar1 = (int)lVar2;
  if (iVar1 == 0) {
    if (in_RSI == (cilk_fiber *)0x0) {
      deallocate_to_heap(in_RDI);
    }
    else {
      deallocate_self(in_RSI,(cilk_fiber_pool *)(ulong)in_stack_ffffffffffffffe8);
    }
  }
  return iVar1;
}

Assistant:

int cilk_fiber::remove_reference(cilk_fiber_pool* pool)
{
    int ref_count = this->dec_ref_count();
    if (ref_count == 0) {
        if (pool) {
            deallocate_self(pool);
        }
        else {
            deallocate_to_heap();
        }
    }
    return ref_count;
}